

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::get_pathname(char *p,dynamic_string *path)

{
  bool bVar1;
  char *pA;
  char *pB;
  undefined1 local_40 [8];
  dynamic_string temp_path;
  dynamic_string temp_drive;
  dynamic_string *path_local;
  char *p_local;
  
  dynamic_string::dynamic_string((dynamic_string *)&temp_path.m_pStr);
  dynamic_string::dynamic_string((dynamic_string *)local_40);
  bVar1 = split_path(p,(dynamic_string *)&temp_path.m_pStr,(dynamic_string *)local_40,
                     (dynamic_string *)0x0,(dynamic_string *)0x0);
  if (bVar1) {
    pA = dynamic_string::get_ptr((dynamic_string *)&temp_path.m_pStr);
    pB = dynamic_string::get_ptr((dynamic_string *)local_40);
    combine_path(path,pA,pB);
  }
  dynamic_string::~dynamic_string((dynamic_string *)local_40);
  dynamic_string::~dynamic_string((dynamic_string *)&temp_path.m_pStr);
  return bVar1;
}

Assistant:

bool file_utils::get_pathname(const char* p, dynamic_string& path)
    {
        dynamic_string temp_drive, temp_path;
        if (!split_path(p, &temp_drive, &temp_path, nullptr, nullptr))
        {
            return false;
        }

        combine_path(path, temp_drive.get_ptr(), temp_path.get_ptr());
        return true;
    }